

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml_print.hpp
# Opt level: O2

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 rapidxml::internal::print_pi_node<std::back_insert_iterator<std::__cxx11::string>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,xml_node<char> *node,int flags,int indent)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *begin;
  
  if (node->m_type == node_pi) {
    if ((flags & 1U) == 0) {
      out = fill_chars<std::back_insert_iterator<std::__cxx11::string>,char>(out,indent,'\t');
    }
    std::__cxx11::string::push_back((char)out.container);
    std::__cxx11::string::push_back((char)out.container);
    pcVar4 = (node->super_xml_base<char>).m_name;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = &xml_base<char>::nullstr()::zero;
      sVar2 = 0;
    }
    else {
      sVar2 = (node->super_xml_base<char>).m_name_size;
    }
    bVar1 = copy_chars<std::back_insert_iterator<std::__cxx11::string>,char>
                      (pcVar4,pcVar4 + sVar2,out);
    std::__cxx11::string::push_back((char)bVar1.container);
    pcVar4 = (node->super_xml_base<char>).m_value;
    pcVar3 = pcVar4;
    begin = &xml_base<char>::nullstr()::zero;
    if (pcVar4 != (char *)0x0) {
      pcVar3 = (char *)(node->super_xml_base<char>).m_value_size;
      begin = pcVar4;
    }
    bVar1 = copy_chars<std::back_insert_iterator<std::__cxx11::string>,char>
                      (begin,pcVar3 + (long)begin,bVar1);
    std::__cxx11::string::push_back((char)bVar1.container);
    std::__cxx11::string::push_back((char)bVar1.container);
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )bVar1.container;
  }
  __assert_fail("node->type() == node_pi",
                "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/rapidxml/rapidxml_print.hpp"
                ,0x174,
                "OutIt rapidxml::internal::print_pi_node(OutIt, const xml_node<Ch> *, int, int) [OutIt = std::back_insert_iterator<std::basic_string<char>>, Ch = char]"
               );
}

Assistant:

inline OutIt print_pi_node(OutIt out, const xml_node<Ch> *node, int flags, int indent)
        {
            assert(node->type() == node_pi);
            if (!(flags & print_no_indenting))
                out = fill_chars(out, indent, Ch('\t'));
            *out = Ch('<'), ++out;
            *out = Ch('?'), ++out;
            out = copy_chars(node->name(), node->name() + node->name_size(), out);
            *out = Ch(' '), ++out;
            out = copy_chars(node->value(), node->value() + node->value_size(), out);
            *out = Ch('?'), ++out;
            *out = Ch('>'), ++out;
            return out;
        }